

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver3.c
# Opt level: O2

sat_solver3 * sat_solver3_new(void)

{
  Sat_Mem_t *p;
  int h;
  sat_solver3 *psVar1;
  clause *pcVar2;
  int in_R8D;
  
  psVar1 = (sat_solver3 *)calloc(0x2a0,1);
  p = &psVar1->Mem;
  Sat_MemAlloc_(p,0x11);
  psVar1->hLearnts = -1;
  h = Sat_MemAppend(p,(int *)0x0,2,0,in_R8D);
  psVar1->hBinary = h;
  pcVar2 = Sat_MemClauseHand(p,h);
  psVar1->binary = pcVar2;
  psVar1->nLearntMax = 10000;
  psVar1->nLearntStart = 10000;
  psVar1->nLearntDelta = 1000;
  psVar1->nLearntRatio = 0x32;
  veci_new(&psVar1->order);
  veci_new(&psVar1->trail_lim);
  veci_new(&psVar1->tagged);
  veci_new(&psVar1->act_clas);
  veci_new(&psVar1->stack);
  veci_new(&psVar1->unit_lits);
  veci_new(&psVar1->temp_clause);
  veci_new(&psVar1->conf_final);
  psVar1->wlists = (veci *)0x0;
  psVar1->activity = (word *)0x0;
  psVar1->VarActType = 0;
  psVar1->ClaActType = 0;
  psVar1->size = 0;
  psVar1->cap = 0;
  psVar1->qhead = 0;
  psVar1->qtail = 0;
  psVar1->orderpos = (int *)0x0;
  psVar1->reasons = (int *)0x0;
  psVar1->trail = (lit *)0x0;
  psVar1->var_inc = 0x20;
  psVar1->var_decay = 0xffffffffffffffff;
  psVar1->cla_inc = 0x800;
  psVar1->cla_decay = 0xffffffff;
  veci_new(&psVar1->act_vars);
  psVar1->root_level = 0;
  psVar1->random_seed = 91648253.0;
  psVar1->progress_estimate = 0.0;
  psVar1->verbosity = 0;
  (psVar1->stats).starts = 0;
  (psVar1->stats).clauses = 0;
  (psVar1->stats).learnts = 0;
  (psVar1->stats).decisions = 0;
  (psVar1->stats).propagations = 0;
  (psVar1->stats).inspects = 0;
  (psVar1->stats).conflicts = 0;
  (psVar1->stats).clauses_literals = 0;
  (psVar1->stats).learnts_literals = 0;
  (psVar1->stats).tot_literals = 0;
  return psVar1;
}

Assistant:

sat_solver3* sat_solver3_new(void)
{
    sat_solver3* s = (sat_solver3*)ABC_CALLOC( char, sizeof(sat_solver3));

//    Vec_SetAlloc_(&s->Mem, 15);
    Sat_MemAlloc_(&s->Mem, 17);
    s->hLearnts = -1;
    s->hBinary = Sat_MemAppend( &s->Mem, NULL, 2, 0, 0 );
    s->binary = clause_read( s, s->hBinary );

    s->nLearntStart = LEARNT_MAX_START_DEFAULT;  // starting learned clause limit
    s->nLearntDelta = LEARNT_MAX_INCRE_DEFAULT;  // delta of learned clause limit
    s->nLearntRatio = LEARNT_MAX_RATIO_DEFAULT;  // ratio of learned clause limit
    s->nLearntMax   = s->nLearntStart;

    // initialize vectors
    veci_new(&s->order);
    veci_new(&s->trail_lim);
    veci_new(&s->tagged);
//    veci_new(&s->learned);
    veci_new(&s->act_clas);
    veci_new(&s->stack);
//    veci_new(&s->model);
    veci_new(&s->unit_lits);
    veci_new(&s->temp_clause);
    veci_new(&s->conf_final);

    // initialize arrays
    s->wlists    = 0;
    s->activity  = 0;
    s->orderpos  = 0;
    s->reasons   = 0;
    s->trail     = 0;

    // initialize other vars
    s->size                   = 0;
    s->cap                    = 0;
    s->qhead                  = 0;
    s->qtail                  = 0;

    solver_init_activities(s);
    veci_new(&s->act_vars);

    s->root_level             = 0;
//    s->simpdb_assigns         = 0;
//    s->simpdb_props           = 0;
    s->random_seed            = 91648253;
    s->progress_estimate      = 0;
//    s->binary                 = (clause*)ABC_ALLOC( char, sizeof(clause) + sizeof(lit)*2);
//    s->binary->size_learnt    = (2 << 1);
    s->verbosity              = 0;

    s->stats.starts           = 0;
    s->stats.decisions        = 0;
    s->stats.propagations     = 0;
    s->stats.inspects         = 0;
    s->stats.conflicts        = 0;
    s->stats.clauses          = 0;
    s->stats.clauses_literals = 0;
    s->stats.learnts          = 0;
    s->stats.learnts_literals = 0;
    s->stats.tot_literals     = 0;
    return s;
}